

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DepthFirstSearch.h
# Opt level: O0

void __thiscall
netlist::
DepthFirstSearch<netlist::NetlistNode,_netlist::NetlistEdge,_netlist::PathFinder::Visitor,_netlist::PathFinder::EdgePredicate>
::DepthFirstSearch(DepthFirstSearch<netlist::NetlistNode,_netlist::NetlistEdge,_netlist::PathFinder::Visitor,_netlist::PathFinder::EdgePredicate>
                   *this,Visitor *visitor,NetlistNode *startNode)

{
  _func_int **in_RSI;
  NetlistNode *in_RDI;
  DepthFirstSearch<netlist::NetlistNode,_netlist::NetlistEdge,_netlist::PathFinder::Visitor,_netlist::PathFinder::EdgePredicate>
  *unaff_retaddr;
  
  (in_RDI->super_Node<netlist::NetlistNode,_netlist::NetlistEdge>)._vptr_Node = in_RSI;
  std::
  set<const_netlist::NetlistNode_*,_std::less<const_netlist::NetlistNode_*>,_std::allocator<const_netlist::NetlistNode_*>_>
  ::set((set<const_netlist::NetlistNode_*,_std::less<const_netlist::NetlistNode_*>,_std::allocator<const_netlist::NetlistNode_*>_>
         *)0x1ce733);
  std::
  vector<std::pair<netlist::NetlistNode_&,___gnu_cxx::__normal_iterator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_*,_std::vector<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>_>_>,_std::allocator<std::pair<netlist::NetlistNode_&,___gnu_cxx::__normal_iterator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_*,_std::vector<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>_>_>_>_>
  ::vector((vector<std::pair<netlist::NetlistNode_&,___gnu_cxx::__normal_iterator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_*,_std::vector<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>_>_>,_std::allocator<std::pair<netlist::NetlistNode_&,___gnu_cxx::__normal_iterator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_*,_std::vector<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>,_std::allocator<std::unique_ptr<netlist::NetlistEdge,_std::default_delete<netlist::NetlistEdge>_>_>_>_>_>_>_>
            *)0x1ce746);
  setup(unaff_retaddr,in_RDI);
  run(this);
  return;
}

Assistant:

DepthFirstSearch(Visitor& visitor, NodeType& startNode) : visitor(visitor) {
        setup(startNode);
        run();
    }